

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall
TestCharReaderFailIfExtraTestcommentAfterBool::runTestCase
          (TestCharReaderFailIfExtraTestcommentAfterBool *this)

{
  TestResult *pTVar1;
  bool actual;
  int iVar2;
  Value *this_00;
  CharReader *pCVar3;
  string errs;
  char doc [27];
  Value root;
  CharReaderBuilder b;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  string local_118;
  string local_f8;
  char local_d8 [40];
  Value local_b0;
  CharReaderBuilder local_88;
  Value local_58;
  
  Json::CharReaderBuilder::CharReaderBuilder(&local_88);
  Json::Value::Value(&local_b0,nullValue);
  builtin_strncpy(local_d8 + 0x10,"\ncomment*/",0xb);
  builtin_strncpy(local_d8," true /*trailing",0x10);
  Json::Value::Value(&local_58,true);
  this_00 = Json::Value::operator[](&local_88.settings_,"failIfExtra");
  Json::Value::operator=(this_00,&local_58);
  Json::Value::~Value(&local_58);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&local_88);
  local_130 = 0;
  local_128[0] = 0;
  local_138 = local_128;
  iVar2 = (*pCVar3->_vptr_CharReader[2])(pCVar3,local_d8,local_d8 + 0x1a,&local_b0,&local_138);
  if ((char)iVar2 == '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderFailIfExtraTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x81c,"ok");
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_118,local_138,local_138 + local_130);
  JsonTest::checkStringEqual
            (pTVar1,&local_f8,&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x81d,"\"\" == errs");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  actual = Json::Value::asBool(&local_b0);
  JsonTest::checkEqual<bool,bool>
            (pTVar1,true,actual,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x81e,"true == root.asBool()");
  (*pCVar3->_vptr_CharReader[1])(pCVar3);
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  Json::Value::~Value(&local_b0);
  Json::CharReaderBuilder::~CharReaderBuilder(&local_88);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, commentAfterBool) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      " true /*trailing\ncomment*/";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT_STRING_EQUAL("", errs);
  JSONTEST_ASSERT_EQUAL(true, root.asBool());
  delete reader;
}